

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O3

ReferenceCounterValueType __thiscall
Diligent::RefCountedObject<Diligent::ITextureGL>::AddRef
          (RefCountedObject<Diligent::ITextureGL> *this)

{
  ReferenceCounterValueType RVar1;
  char (*in_RCX) [26];
  RefCountersImpl *this_00;
  string msg;
  string local_30;
  
  this_00 = this->m_pRefCounters;
  if (this_00 == (RefCountersImpl *)0x0) {
    FormatString<char[26],char[26]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"AddRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x221);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    this_00 = this->m_pRefCounters;
  }
  RVar1 = RefCountersImpl::AddStrongRef(this_00);
  return RVar1;
}

Assistant:

AddRef() override final
    {
        VERIFY_EXPR(m_pRefCounters != nullptr);
        // Since type of m_pRefCounters is RefCountersImpl,
        // this call will not be virtual and should be inlined
        return m_pRefCounters->AddStrongRef();
    }